

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandOrPos(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Abc_Ntk_t *pNtk_00;
  Aig_Man_t *pMan_00;
  Abc_Ntk_t *pNtk_01;
  char *pcVar6;
  Abc_Ntk_t *pNtkRes;
  Aig_Man_t *pMan;
  int c;
  int fXor;
  int fComb;
  int fReverse;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  pMan._4_4_ = 0;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"rxh"), iVar2 != -1) {
    if (iVar2 != 99) {
      if (iVar2 == 0x72) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      else {
        if (iVar2 != 0x78) {
          Abc_Print(-2,"usage: orpos [-rxh]\n");
          Abc_Print(-2,
                    "\t        creates single-output miter by ORing the POs of the current network\n"
                   );
          pcVar6 = "no";
          if (bVar1) {
            pcVar6 = "yes";
          }
          Abc_Print(-2,
                    "\t-r    : performs the reverse transform (OR decomposition) [default = %s]\n",
                    pcVar6);
          pcVar6 = "no";
          if (pMan._4_4_ != 0) {
            pcVar6 = "yes";
          }
          Abc_Print(-2,"\t-x    : toggles combining the PO using XOR [default = %s]\n",pcVar6);
          Abc_Print(-2,"\t-h    : print the command usage\n");
          return 1;
        }
        pMan._4_4_ = pMan._4_4_ ^ 1;
      }
    }
  }
  if (pNtk_00 == (Abc_Ntk_t *)0x0) {
    Abc_Print(-1,"Empty network.\n");
    pAbc_local._4_4_ = 1;
  }
  else {
    iVar2 = Abc_NtkIsStrash(pNtk_00);
    if (iVar2 == 0) {
      Abc_Print(-1,"The network is not strashed.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      if (bVar1) {
        pMan_00 = Abc_NtkToDarBmc(pNtk_00,(Vec_Int_t **)0x0);
        pNtk_01 = Abc_NtkFromAigPhase(pMan_00);
        Aig_ManStop(pMan_00);
        iVar2 = Abc_NtkPoNum(pNtk_00);
        iVar3 = Abc_NtkPoNum(pNtk_01);
        if (iVar2 == iVar3) {
          Abc_Print(1,"The output(s) cannot be structurally decomposed.\n");
        }
        else {
          uVar4 = Abc_NtkPoNum(pNtk_00);
          uVar5 = Abc_NtkPoNum(pNtk_01);
          Abc_Print(1,"Expanded %d outputs into %d outputs using OR decomposition.\n",(ulong)uVar4,
                    (ulong)uVar5);
        }
        if ((pAbc->pCex != (Abc_Cex_t *)0x0) && (pAbc->pCex != (Abc_Cex_t *)0x0)) {
          free(pAbc->pCex);
          pAbc->pCex = (Abc_Cex_t *)0x0;
        }
        if (pNtk_01->pName != (char *)0x0) {
          free(pNtk_01->pName);
          pNtk_01->pName = (char *)0x0;
        }
        pcVar6 = Extra_UtilStrsav(pNtk_00->pName);
        pNtk_01->pName = pcVar6;
        Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_01);
      }
      else {
        iVar2 = Abc_NtkCombinePos(pNtk_00,0,pMan._4_4_);
        if (iVar2 == 0) {
          Abc_Print(-1,"ORing the POs has failed.\n");
          return 1;
        }
        if (pAbc->pCex != (Abc_Cex_t *)0x0) {
          pAbc->pCex->iPo = 0;
        }
      }
      pAbc_local._4_4_ = 0;
    }
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandOrPos( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);//, * pNtkRes;
    int fReverse = 0;
    int fComb = 0;
    int fXor = 0;
    int c;
    extern int Abc_NtkCombinePos( Abc_Ntk_t * pNtk, int fAnd, int fXor );

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "rxh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'r':
            fReverse ^= 1;
            break;
        case 'x':
            fXor ^= 1;
            break;
        case 'c':
            fComb ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "The network is not strashed.\n" );
        return 1;
    }
    // get the new network
    if ( fReverse )
    {
        extern Aig_Man_t * Abc_NtkToDarBmc( Abc_Ntk_t * pNtk, Vec_Int_t ** pvMap );
        Aig_Man_t * pMan = Abc_NtkToDarBmc( pNtk, NULL );
        Abc_Ntk_t * pNtkRes = Abc_NtkFromAigPhase( pMan );
        Aig_ManStop( pMan );
        // perform expansion
        if ( Abc_NtkPoNum(pNtk) != Abc_NtkPoNum(pNtkRes) )
            Abc_Print( 1,"Expanded %d outputs into %d outputs using OR decomposition.\n", Abc_NtkPoNum(pNtk), Abc_NtkPoNum(pNtkRes) );
        else
            Abc_Print( 1,"The output(s) cannot be structurally decomposed.\n" );
        // clear counter-example
        if ( pAbc->pCex )
            ABC_FREE( pAbc->pCex );
        // replace the current network
        ABC_FREE( pNtkRes->pName );
        pNtkRes->pName = Extra_UtilStrsav(pNtk->pName);
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    }
    else
    {
        if ( !Abc_NtkCombinePos( pNtk, 0, fXor ) )
        {
            Abc_Print( -1, "ORing the POs has failed.\n" );
            return 1;
        }
        // update counter-example
        if ( pAbc->pCex )
            pAbc->pCex->iPo = 0;
        // replace the current network
    //    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: orpos [-rxh]\n" );
    Abc_Print( -2, "\t        creates single-output miter by ORing the POs of the current network\n" );
    Abc_Print( -2, "\t-r    : performs the reverse transform (OR decomposition) [default = %s]\n", fReverse? "yes": "no" );
    Abc_Print( -2, "\t-x    : toggles combining the PO using XOR [default = %s]\n", fXor? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}